

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.c
# Opt level: O0

int get_one_number(dmr_C *C,int c,int next,stream_t *stream)

{
  tokenizer_state_t *ptVar1;
  ulong uVar2;
  token *ptVar3;
  char *__src;
  position pos;
  char *pcVar4;
  long kclass;
  size_t len;
  char *buffer_end;
  char *buf;
  char *p;
  char *buffer;
  token *token;
  stream_t *stream_local;
  int next_local;
  int c_local;
  dmr_C *C_local;
  
  ptVar1 = C->T;
  __src = ptVar1->number_buffer;
  pcVar4 = ptVar1->string_buffer2;
  buf = ptVar1->number_buffer + 1;
  *__src = (char)c;
  stream_local._0_4_ = next;
  while (uVar2 = C->T->cclass[(int)stream_local + 1], (uVar2 & 0x13) != 0) {
    if (buf != pcVar4) {
      *buf = (char)(int)stream_local;
      buf = buf + 1;
    }
    stream_local._0_4_ = nextchar(C,stream);
    if (((uVar2 & 8) != 0) && (((int)stream_local == 0x2d || ((int)stream_local == 0x2b)))) {
      if (buf != pcVar4) {
        *buf = (char)(int)stream_local;
        buf = buf + 1;
      }
      stream_local._0_4_ = nextchar(C,stream);
    }
  }
  if (buf == pcVar4) {
    pos = stream_pos(stream);
    dmrC_sparse_error(C,pos,"number token exceeds %td characters",(long)pcVar4 - (long)__src);
    *__src = '1';
    buf = ptVar1->number_buffer + 1;
  }
  *buf = '\0';
  pcVar4 = (char *)dmrC_allocator_allocate(&C->byte_allocator,(size_t)(buf + (1 - (long)__src)));
  memcpy(pcVar4,__src,(size_t)(buf + (1 - (long)__src)));
  ptVar3 = stream->token;
  ptVar3->pos = (position)((ulong)ptVar3->pos & 0xffffffffffffffc0 | 4);
  (ptVar3->field_2).number = pcVar4;
  add_token(stream);
  return (int)stream_local;
}

Assistant:

static int get_one_number(struct dmr_C *C, int c, int next, stream_t *stream)
{
	struct token *token;
	char *buffer = C->T->number_buffer;
	char *p = buffer, *buf, *buffer_end = buffer + sizeof C->T->number_buffer;
	size_t len;

	*p++ = c;
	for (;;) {
		long kclass = C->T->cclass[next + 1];
		if (!(kclass & (Dot | Digit | Letter)))
			break;
		if (p != buffer_end)
			*p++ = next;
		next = nextchar(C, stream);
		if (kclass & Exp) {
			if (next == '-' || next == '+') {
				if (p != buffer_end)
					*p++ = next;
				next = nextchar(C, stream);
			}
		}
	}

	if (p == buffer_end) {
		dmrC_sparse_error(C, stream_pos(stream),
			     "number token exceeds %td characters",
			     buffer_end - buffer);
		// Pretend we saw just "1".
		buffer[0] = '1';
		p = buffer + 1;
	}

	*p++ = 0;
	len = p - buffer;
	buf = (char *)dmrC_allocator_allocate(&C->byte_allocator, len);
	memcpy(buf, buffer, len);

	token = stream->token;
	dmrC_token_type(token) = TOKEN_NUMBER;
	token->number = buf;
	add_token(stream);

	return next;
}